

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O2

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,
          _func_void_AsyncResult<int>_AsyncResult<int>_AsyncResult<int>_int *param,
          AsyncResult<int> *param_2,AsyncResult<int> *param_3,AsyncResult<int> *param_4,int *param_5
          )

{
  std::mutex::lock(&this->guard_);
  PrioExecution::
  push<void(*)(nrg::AsyncResult<int>,nrg::AsyncResult<int>,nrg::AsyncResult<int>,int),nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,nrg::AsyncResult<int>&,int>
            (&this->queue_,param,param_2,param_3,param_4,param_5);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }